

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall polyscope::Group::addChildGroup(Group *this,Group *newChild)

{
  _Atomic_word *p_Var1;
  uint64_t *puVar2;
  int iVar3;
  Group *pGVar4;
  long *plVar5;
  long *plVar6;
  uint64_t *puVar7;
  size_type *psVar8;
  WeakHandle<polyscope::Group> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cullExpiredChildren(this);
  unparent(newChild);
  pGVar4 = getTopLevelGrandparent(this);
  if (pGVar4 == newChild) {
    std::operator+(&local_50,"Attempted to make group ",&newChild->name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
      local_f0 = (long *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,(ulong)(this->name)._M_dataplus._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_110 = &local_100;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_100 = *plVar6;
      lStack_f8 = plVar5[3];
    }
    else {
      local_100 = *plVar6;
      local_110 = (long *)*plVar5;
    }
    local_108 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_110,(ulong)(this->name)._M_dataplus._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar5;
    }
    local_a8 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(newChild->name)._M_dataplus._M_p);
    puVar2 = &local_130.super_GenericWeakHandle.targetUniqueID;
    puVar7 = (uint64_t *)(plVar5 + 2);
    if ((uint64_t *)*plVar5 == puVar7) {
      local_130.super_GenericWeakHandle.targetUniqueID = *puVar7;
      local_130.targetPtr = (Group *)plVar5[3];
      local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)puVar2;
    }
    else {
      local_130.super_GenericWeakHandle.targetUniqueID = *puVar7;
      local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)*plVar5;
    }
    local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    exception(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((uint64_t *)
        local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != puVar2) {
      operator_delete(local_130.super_GenericWeakHandle.sentinel.
                      super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    WeakReferrable::getWeakHandle<polyscope::Group>
              (&local_130,(WeakReferrable *)((long)&this->_vptr_Group + (long)this->_vptr_Group[-3])
               ,(Group *)0x0);
    std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&newChild->parentGroup,
               (__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)&local_130);
    (newChild->parentGroup).super_GenericWeakHandle.targetUniqueID =
         local_130.super_GenericWeakHandle.targetUniqueID;
    (newChild->parentGroup).targetPtr = local_130.targetPtr;
    if (local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_130.super_GenericWeakHandle.sentinel.
                   super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_130.super_GenericWeakHandle.sentinel.
                 super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
        ;
        (local_130.super_GenericWeakHandle.sentinel.
         super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
             iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_130.super_GenericWeakHandle.sentinel.
           super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[3])();
      }
    }
    WeakReferrable::getWeakHandle<polyscope::Group>
              (&local_130,
               (WeakReferrable *)((long)&newChild->_vptr_Group + (long)newChild->_vptr_Group[-3]),
               (Group *)0x0);
    std::
    vector<polyscope::WeakHandle<polyscope::Group>,std::allocator<polyscope::WeakHandle<polyscope::Group>>>
    ::emplace_back<polyscope::WeakHandle<polyscope::Group>>
              ((vector<polyscope::WeakHandle<polyscope::Group>,std::allocator<polyscope::WeakHandle<polyscope::Group>>>
                *)&this->childrenGroups,&local_130);
    if (local_130.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_130.super_GenericWeakHandle.sentinel.
                   super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_130.super_GenericWeakHandle.sentinel.
                 super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
        ;
        (local_130.super_GenericWeakHandle.sentinel.
         super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
             iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_130.super_GenericWeakHandle.sentinel.
           super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[3])();
      }
    }
  }
  return;
}

Assistant:

void Group::addChildGroup(Group& newChild) {
  cullExpiredChildren();

  // if child is already in a group, remove it from that group
  newChild.unparent();

  if (getTopLevelGrandparent() == &newChild) {
    exception("Attempted to make group " + newChild.name + " a child of " + name +
              ", but this would create a cycle (group " + name + " is already a descendant of " + newChild.name + ")");
    return;
  }

  // assign to the new group
  newChild.parentGroup = this->getWeakHandle<Group>(); // we want a weak pointer to the shared ptr
  childrenGroups.push_back(newChild.getWeakHandle<Group>());
}